

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

json __thiscall Population::toJson_abi_cxx11_(Population *this)

{
  json_value jVar1;
  reference pvVar2;
  json_value extraout_RDX;
  uint16_t uVar3;
  ulong *in_RSI;
  json jVar4;
  type_data_t local_50 [4];
  json_value local_48;
  type_data_t local_40 [4];
  json_value local_38;
  type_data_t local_30 [4];
  json_value local_28;
  
  *(undefined2 *)&this->minFitness = 0;
  this->maxFitness = 0.0;
  local_28 = (json_value)*in_RSI;
  local_30[0].data = 7;
  uVar3 = 7;
  if (0x7fefffffffffffff < (local_28.number_unsigned & 0x7fffffffffffffff)) {
    local_30[0].data = 0;
    local_28.object = (object_t *)0x0;
    uVar3 = 0;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                       *)this,"minFitness");
  local_30[0].bits = *(anon_struct_2_6_e09b849c_for_bits *)&pvVar2->m_type;
  (pvVar2->m_type).data = uVar3;
  jVar1 = pvVar2->m_value;
  (pvVar2->m_value).number_unsigned = (number_unsigned_t)local_28;
  local_28 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_30[0].bits);
  local_38 = (json_value)in_RSI[1];
  local_40[0].data = 7;
  uVar3 = 7;
  if (0x7fefffffffffffff < (local_38.number_unsigned & 0x7fffffffffffffff)) {
    local_40[0].data = 0;
    local_38.object = (object_t *)0x0;
    uVar3 = 0;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                       *)this,"maxFitness");
  local_40[0].bits = *(anon_struct_2_6_e09b849c_for_bits *)&pvVar2->m_type;
  (pvVar2->m_type).data = uVar3;
  jVar1 = pvVar2->m_value;
  (pvVar2->m_value).number_unsigned = (number_unsigned_t)local_38;
  local_38 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_40[0].bits);
  local_48 = (json_value)in_RSI[2];
  local_50[0].data = 7;
  uVar3 = 7;
  if (0x7fefffffffffffff < (local_48.number_unsigned & 0x7fffffffffffffff)) {
    local_50[0].data = 0;
    local_48.object = (object_t *)0x0;
    uVar3 = 0;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator>
                       *)this,"averageFitness");
  local_50[0].bits = *(anon_struct_2_6_e09b849c_for_bits *)&pvVar2->m_type;
  (pvVar2->m_type).data = uVar3;
  jVar1 = pvVar2->m_value;
  (pvVar2->m_value).number_unsigned = (number_unsigned_t)local_48;
  local_48 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                 *)&local_50[0].bits);
  jVar4.m_value.object = extraout_RDX.object;
  jVar4._0_8_ = this;
  return jVar4;
}

Assistant:

json Population::toJson() {
    json j;
    j["minFitness"] = minFitness;
    j["maxFitness"] = maxFitness;
    j["averageFitness"] = averageFitness;
    return j;
}